

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_13x13(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  JSAMPROW pJVar9;
  ulong uVar10;
  DCTELEM *pDVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  DCTELEM *local_128;
  DCTELEM local_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar10 = (ulong)start_col;
  lVar14 = 0;
  local_128 = data;
  do {
    pJVar9 = sample_data[lVar14];
    uVar24 = (uint)pJVar9[uVar10] + (uint)pJVar9[uVar10 + 0xc];
    uVar31 = (uint)pJVar9[uVar10 + 1] + (uint)pJVar9[uVar10 + 0xb];
    uVar15 = (uint)pJVar9[uVar10 + 2] + (uint)pJVar9[uVar10 + 10];
    uVar28 = (uint)pJVar9[uVar10 + 3] + (uint)pJVar9[uVar10 + 9];
    lVar22 = (ulong)pJVar9[uVar10] - (ulong)pJVar9[uVar10 + 0xc];
    uVar17 = (uint)pJVar9[uVar10 + 4] + (uint)pJVar9[uVar10 + 8];
    lVar26 = (ulong)pJVar9[uVar10 + 1] - (ulong)pJVar9[uVar10 + 0xb];
    lVar13 = (ulong)pJVar9[uVar10 + 2] - (ulong)pJVar9[uVar10 + 10];
    lVar12 = (ulong)pJVar9[uVar10 + 3] - (ulong)pJVar9[uVar10 + 9];
    uVar21 = (uint)pJVar9[uVar10 + 5] + (uint)pJVar9[uVar10 + 7];
    bVar1 = pJVar9[uVar10 + 6];
    lVar30 = (ulong)pJVar9[uVar10 + 4] - (ulong)pJVar9[uVar10 + 8];
    lVar27 = (ulong)pJVar9[uVar10 + 5] - (ulong)pJVar9[uVar10 + 7];
    *local_128 = uVar17 + bVar1 + uVar28 + uVar15 + uVar31 + uVar24 + uVar21 + -0x680;
    uVar19 = (ulong)((uint)bVar1 + (uint)bVar1);
    lVar25 = uVar24 - uVar19;
    lVar32 = uVar31 - uVar19;
    lVar16 = uVar15 - uVar19;
    lVar29 = uVar28 - uVar19;
    lVar18 = uVar17 - uVar19;
    lVar23 = uVar21 - uVar19;
    local_128[2] = (DCTELEM)((ulong)(lVar23 * 0x1fffffffd7ee + lVar18 * 0x1fffffffe64b + 0x1000 +
                                    lVar29 * 0x1ffffffffa8c + lVar16 * 0x100c +
                                    lVar32 * 0x21e0 + lVar25 * 0x2bf1) >> 0xd);
    lVar20 = (lVar32 - lVar23) * -0xa20 + (lVar29 - lVar18) * -0xdf2 + (lVar25 - lVar16) * 0x24f9;
    lVar16 = (lVar23 + lVar32) * 0xf95 + (lVar18 + lVar29) * -0x1dfe + (lVar16 + lVar25) * 0x319;
    local_128[4] = (DCTELEM)(lVar16 + lVar20 + 0x1000U >> 0xd);
    local_128[6] = (DCTELEM)((lVar20 - lVar16) + 0x1000U >> 0xd);
    lVar23 = (lVar26 + lVar22) * 0x2a50;
    lVar18 = (lVar13 + lVar22) * 0x253e;
    lVar16 = (lVar27 + lVar30) * 0xad5 + (lVar22 + lVar12) * 0x1e02;
    lVar20 = (lVar13 + lVar26) * -0xad5 + (lVar30 - lVar27) * 0x1e02;
    local_128[1] = (DCTELEM)((ulong)(lVar30 * 0xa33 + lVar18 +
                                     lVar23 + lVar22 * 0x1fffffffbf5b + 0x1000 + lVar16) >> 0xd);
    lVar22 = (lVar26 + lVar12) * -0x253e;
    local_128[3] = (DCTELEM)((ulong)(lVar30 * 0x1fffffffb511 + lVar22 +
                                     lVar26 * 0x1acb + lVar23 + 0x1000 + lVar20) >> 0xd);
    lVar23 = (lVar13 + lVar12) * -0x1508;
    local_128[5] = (DCTELEM)((ulong)(lVar20 + 0x1000 +
                                    lVar27 * 0x4853 + lVar23 + lVar13 * -0x324f + lVar18) >> 0xd);
    local_128[7] = (DCTELEM)((ulong)(lVar16 + 0x1000 +
                                    lVar27 * 0x1fffffffc83f + lVar22 + lVar12 * 0x4694 + lVar23) >>
                            0xd);
    pDVar11 = local_d8;
    if ((int)lVar14 != 7) {
      if ((int)lVar14 == 0xc) {
        lVar14 = 0;
        do {
          iVar2 = aiStack_58[lVar14];
          iVar3 = data[lVar14];
          lVar16 = (long)(iVar3 + iVar2);
          iVar4 = aiStack_78[lVar14];
          lVar12 = (long)(iVar4 + data[lVar14 + 8]);
          iVar5 = data[lVar14 + 0x10];
          iVar6 = aiStack_98[lVar14];
          lVar22 = (long)(iVar6 + iVar5);
          iVar7 = local_d8[lVar14];
          iVar8 = aiStack_b8[lVar14];
          lVar20 = (long)(iVar8 + data[lVar14 + 0x18]);
          lVar18 = (long)(iVar7 + data[lVar14 + 0x20]);
          lVar26 = (long)(data[lVar14 + 0x38] + data[lVar14 + 0x28]);
          lVar13 = (long)data[lVar14 + 0x30];
          data[lVar14] = (DCTELEM)((lVar18 + lVar26 + lVar13 + lVar22 + lVar20 + lVar12 + lVar16) *
                                   0x183d + 0x2000U >> 0xe);
          lVar16 = lVar16 + lVar13 * -2;
          lVar12 = lVar12 + lVar13 * -2;
          lVar22 = lVar22 + lVar13 * -2;
          lVar20 = lVar20 + lVar13 * -2;
          lVar18 = lVar18 + lVar13 * -2;
          lVar26 = lVar26 + lVar13 * -2;
          data[lVar14 + 0x10] =
               (DCTELEM)((ulong)(lVar26 * 0x3fffffffe1a6 + lVar18 * 0x3fffffffec87 + 0x2000 +
                                lVar20 * 0x3ffffffffbde + lVar22 * 0xc28 +
                                lVar12 * 0x19a8 + lVar16 * 0x2148) >> 0xe);
          lVar25 = (lVar12 - lVar26) * -0x7ab +
                   (lVar20 - lVar18) * -0xa90 + (lVar16 - lVar22) * 0x1c01;
          lVar29 = (long)(iVar3 - iVar2);
          lVar32 = (long)(data[lVar14 + 8] - iVar4);
          lVar27 = (long)(iVar5 - iVar6);
          lVar23 = (long)(data[lVar14 + 0x18] - iVar8);
          lVar30 = (long)(data[lVar14 + 0x20] - iVar7);
          lVar13 = (long)(data[lVar14 + 0x28] - data[lVar14 + 0x38]);
          lVar16 = (lVar26 + lVar12) * 0xbcd +
                   (lVar18 + lVar20) * -0x16b8 + (lVar22 + lVar16) * 0x259;
          data[lVar14 + 0x20] = (DCTELEM)(lVar16 + lVar25 + 0x2000U >> 0xe);
          data[lVar14 + 0x30] = (DCTELEM)((lVar25 - lVar16) + 0x2000U >> 0xe);
          lVar22 = (lVar32 + lVar29) * 0x200c;
          lVar18 = (lVar27 + lVar29) * 0x1c35;
          lVar12 = (lVar13 + lVar30) * 0x834 + (lVar23 + lVar29) * 0x16bb;
          lVar20 = (lVar27 + lVar32) * -0x834 + (lVar30 - lVar13) * 0x16bb;
          data[lVar14 + 8] =
               (DCTELEM)((ulong)(lVar30 * 0x7ba + lVar18 + lVar22 + lVar29 * 0x3fffffffcf0a + 0x2000
                                + lVar12) >> 0xe);
          lVar16 = (lVar23 + lVar32) * -0x1c35;
          data[lVar14 + 0x18] =
               (DCTELEM)((ulong)(lVar30 * 0x3fffffffc73f + lVar16 +
                                 lVar22 + lVar32 * 0x144b + 0x2000 + lVar20) >> 0xe);
          lVar22 = (lVar23 + lVar27) * -0xfee;
          data[lVar14 + 0x28] =
               (DCTELEM)((ulong)(lVar20 + 0x2000 +
                                lVar13 * 0x36c7 + lVar22 + lVar27 * -0x261a + lVar18) >> 0xe);
          data[lVar14 + 0x38] =
               (DCTELEM)((ulong)(lVar12 + 0x2000 +
                                lVar13 * 0x3fffffffd5c5 + lVar16 + lVar23 * 0x3575 + lVar22) >> 0xe)
          ;
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != 8);
        return;
      }
      pDVar11 = local_128 + 8;
    }
    lVar14 = lVar14 + 1;
    local_128 = pDVar11;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_13x13 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  INT32 z1, z2;
  DCTELEM workspace[8*5];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/26). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[12]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[11]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[10]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[9]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[8]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[7]);
    tmp6 = GETJSAMPLE(elemptr[6]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[12]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[11]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[10]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[9]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[8]);
    tmp15 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6 - 13 * CENTERJSAMPLE);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.373119086)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(1.058554052)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.501487041)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.170464608)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.803364869)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(1.252223920)),    /* c4 */
	      CONST_BITS);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(1.155388986)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.435816023)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.316450131));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.096834934)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.937303064)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.486914739));  /* (c8+c12)/2 */

    dataptr[4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.322312651));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.163874945));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.937797057)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.338443458));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(2.020082300)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.318774355));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.937797057)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.338443458));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.163874945)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.837223564)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(2.341699410));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.657217813)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.572116027)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(2.260109708));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(2.205608352)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.742345811));          /* c1+c11 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 13)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/13)**2 = 64/169, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/26) * 128/169.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*2];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*1];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*0];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*7];
    tmp6 = dataptr[DCTSIZE*6];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*4];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*3];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*2];
    tmp13 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*1];
    tmp14 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*0];
    tmp15 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6,
		       FIX(0.757396450)),          /* 128/169 */
	      CONST_BITS+1);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.039995521)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(0.801745081)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.379824504)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.129109289)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.608465700)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(0.948429952)),    /* c4 */
	      CONST_BITS+1);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(0.875087516)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.330085509)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.239678205));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.073342435)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.709910013)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.368787494));  /* (c8+c12)/2 */

    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS+1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.001514908));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(0.881514751));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.710284161)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.256335874));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(1.530003162)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.241438564));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.710284161)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.256335874));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(0.881514751)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.634110155)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(1.773594819));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.497774438)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.190715098)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(1.711799069));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(1.670519935)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.319646532));          /* c1+c11 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}